

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void qcc_list_push_back(qcc_list *list,qcc_list_node *node)

{
  qcc_list_node *node_local;
  qcc_list *list_local;
  
  if (list->last == (qcc_list_node *)0x0) {
    list->first = node;
  }
  else {
    list->last->next = node;
  }
  node->next = (qcc_list_node *)0x0;
  list->last = node;
  return;
}

Assistant:

void qcc_list_push_back(struct qcc_list *list, struct qcc_list_node *node)
{
    if (list->last)
        list->last->next = node;
    else
        list->first = node;

    node->next = 0;
    list->last = node;
}